

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * jsonnet::internal::jsonnet_unlex(string *__return_storage_ptr__,Tokens *tokens)

{
  int iVar1;
  _List_node_base *p_Var2;
  char cVar3;
  char cVar4;
  ostream *poVar5;
  long lVar6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  char *pcVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  _List_node_base *p_Var10;
  stringstream ss;
  char local_1d1;
  string *local_1d0;
  _List_node_base *local_1c8;
  _List_node_base *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  p_Var8 = (tokens->
           super__List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>).
           _M_impl._M_node.super__List_node_base._M_next;
  local_1c8 = (_List_node_base *)tokens;
  if (p_Var8 != (_List_node_base *)tokens) {
    local_1d0 = __return_storage_ptr__;
    do {
      p_Var7 = p_Var8[1]._M_prev;
      local_1c0 = (p_Var8 + 1)[1]._M_next;
      if (p_Var7 != local_1c0) {
        do {
          iVar1 = *(int *)&p_Var7->_M_next;
          if (iVar1 == 2) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Paragraph(\n",0xb);
            p_Var2 = p_Var7[1]._M_prev;
            for (p_Var10 = p_Var7[1]._M_next; p_Var10 != p_Var2; p_Var10 = p_Var10 + 2) {
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    ",4);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (local_1a8,(char *)p_Var10->_M_next,(long)p_Var10->_M_prev);
              local_1d1 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_1d1,1);
            }
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            lVar6 = 1;
            pcVar9 = "\n";
LAB_0016fa5e:
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar6);
          }
          else {
            if (iVar1 == 1) {
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Interstitial(",0xd);
              poVar5 = local_1a8;
LAB_0016f9b1:
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar5,(char *)(p_Var7[1]._M_next)->_M_next,
                                  (long)(p_Var7[1]._M_next)->_M_prev);
LAB_0016f9c3:
              lVar6 = 2;
              pcVar9 = ")\n";
              goto LAB_0016fa5e;
            }
            if (iVar1 == 0) {
              if (p_Var7[1]._M_prev != p_Var7[1]._M_next) {
                std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"LineEnd(",8);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
                goto LAB_0016f9b1;
              }
              std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"LineEnd(",8);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
              poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
              goto LAB_0016f9c3;
            }
          }
          p_Var7 = (_List_node_base *)&p_Var7[2]._M_prev;
        } while (p_Var7 != local_1c0);
      }
      __return_storage_ptr__ = local_1d0;
      iVar1 = *(int *)&p_Var8[1]._M_next;
      if (iVar1 < 0xf) {
        if (iVar1 == 0xd) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)p_Var8[3]._M_next,(long)p_Var8[3]._M_prev);
          lVar6 = 2;
          pcVar9 = "\"\n";
        }
        else {
          if (iVar1 != 0xe) goto LAB_0016fbe9;
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\'",1);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)p_Var8[3]._M_next,(long)p_Var8[3]._M_prev);
          lVar6 = 2;
          pcVar9 = "\'\n";
        }
      }
      else if (iVar1 == 0xf) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"|||\n",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,*(char **)(p_Var8 + 4 + 1),*(long *)((long)(p_Var8 + 4 + 1) + 8));
        p_Var7 = p_Var8[3]._M_next;
        cVar4 = *(char *)&(p_Var8[3]._M_next)->_M_next;
        cVar3 = local_1d1;
        while (local_1d1 = cVar4, local_1d1 != '\0') {
          p_Var10 = (_List_node_base *)((long)&p_Var7->_M_next + 1);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1d1,1);
          if (((*(char *)&p_Var7->_M_next == '\n') && (*(char *)&p_Var10->_M_next != '\0')) &&
             (*(char *)&p_Var10->_M_next != '\n')) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,*(char **)(p_Var8 + 4 + 1),*(long *)((long)(p_Var8 + 4 + 1) + 8));
          }
          p_Var7 = p_Var10;
          cVar3 = local_1d1;
          cVar4 = *(char *)&p_Var10->_M_next;
        }
        local_1d1 = cVar3;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,*(char **)(p_Var8 + 6 + 1),(long)p_Var8[7]._M_prev);
        lVar6 = 4;
        pcVar9 = "|||\n";
        __return_storage_ptr__ = local_1d0;
      }
      else {
        if (iVar1 == 0x24) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"EOF\n",4);
          break;
        }
LAB_0016fbe9:
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)p_Var8[3]._M_next,(long)p_Var8[3]._M_prev);
        lVar6 = 1;
        pcVar9 = "\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar9,lVar6);
      p_Var8 = (((_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
                &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var8 != local_1c8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string jsonnet_unlex(const Tokens &tokens)
{
    std::stringstream ss;
    for (const auto &t : tokens) {
        for (const auto &f : t.fodder) {
            switch (f.kind) {
                case FodderElement::LINE_END: {
                    if (f.comment.size() > 0) {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ", " << f.comment[0]
                           << ")\n";
                    } else {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ")\n";
                    }
                } break;

                case FodderElement::INTERSTITIAL: {
                    ss << "Interstitial(" << f.comment[0] << ")\n";
                } break;

                case FodderElement::PARAGRAPH: {
                    ss << "Paragraph(\n";
                    for (const auto &line : f.comment) {
                        ss << "    " << line << '\n';
                    }
                    ss << ")" << f.blanks << "\n";
                } break;
            }
        }
        if (t.kind == Token::END_OF_FILE) {
            ss << "EOF\n";
            break;
        }
        if (t.kind == Token::STRING_DOUBLE) {
            ss << "\"" << t.data << "\"\n";
        } else if (t.kind == Token::STRING_SINGLE) {
            ss << "'" << t.data << "'\n";
        } else if (t.kind == Token::STRING_BLOCK) {
            ss << "|||\n";
            ss << t.stringBlockIndent;
            for (const char *cp = t.data.c_str(); *cp != '\0'; ++cp) {
                ss << *cp;
                if (*cp == '\n' && *(cp + 1) != '\n' && *(cp + 1) != '\0') {
                    ss << t.stringBlockIndent;
                }
            }
            ss << t.stringBlockTermIndent << "|||\n";
        } else {
            ss << t.data << "\n";
        }
    }
    return ss.str();
}